

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ushl_i64_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_i64 dst,TCGv_i64 src,TCGv_i64 shift)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  TCGv_i64 v2;
  TCGv_i64 c2;
  TCGv_i64 max;
  TCGv_i64 zero;
  TCGv_i64 rsh;
  TCGv_i64 lsh;
  TCGv_i64 rval;
  TCGv_i64 lval;
  TCGv_i64 shift_local;
  TCGv_i64 src_local;
  TCGv_i64 dst_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  ret_02 = tcg_temp_new_i64(tcg_ctx);
  v2 = tcg_const_i64_aarch64(tcg_ctx,0);
  c2 = tcg_const_i64_aarch64(tcg_ctx,0x40);
  tcg_gen_ext8s_i64_aarch64(tcg_ctx,ret_01,shift);
  tcg_gen_neg_i64(tcg_ctx,ret_02,ret_01);
  tcg_gen_shl_i64_aarch64(tcg_ctx,ret,src,ret_01);
  tcg_gen_shr_i64_aarch64(tcg_ctx,ret_00,src,ret_02);
  tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_LTU,dst,ret_01,c2,ret,v2);
  tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_LTU,dst,ret_02,c2,ret_00,dst);
  tcg_temp_free_i64(tcg_ctx,ret);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  tcg_temp_free_i64(tcg_ctx,ret_01);
  tcg_temp_free_i64(tcg_ctx,ret_02);
  tcg_temp_free_i64(tcg_ctx,v2);
  tcg_temp_free_i64(tcg_ctx,c2);
  return;
}

Assistant:

void gen_ushl_i64(TCGContext *tcg_ctx, TCGv_i64 dst, TCGv_i64 src, TCGv_i64 shift)
{
    TCGv_i64 lval = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 rval = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 lsh = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 rsh = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 zero = tcg_const_i64(tcg_ctx, 0);
    TCGv_i64 max = tcg_const_i64(tcg_ctx, 64);

    /*
     * Rely on the TCG guarantee that out of range shifts produce
     * unspecified results, not undefined behaviour (i.e. no trap).
     * Discard out-of-range results after the fact.
     */
    tcg_gen_ext8s_i64(tcg_ctx, lsh, shift);
    tcg_gen_neg_i64(tcg_ctx, rsh, lsh);
    tcg_gen_shl_i64(tcg_ctx, lval, src, lsh);
    tcg_gen_shr_i64(tcg_ctx, rval, src, rsh);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LTU, dst, lsh, max, lval, zero);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LTU, dst, rsh, max, rval, dst);

    tcg_temp_free_i64(tcg_ctx, lval);
    tcg_temp_free_i64(tcg_ctx, rval);
    tcg_temp_free_i64(tcg_ctx, lsh);
    tcg_temp_free_i64(tcg_ctx, rsh);
    tcg_temp_free_i64(tcg_ctx, zero);
    tcg_temp_free_i64(tcg_ctx, max);
}